

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_tls_prf(mbedtls_tls_prf_types prf,uchar *secret,size_t slen,char *label,
                       uchar *random,size_t rlen,uchar *dstbuf,size_t dlen)

{
  mbedtls_ssl_tls_prf_cb *tls_prf;
  size_t rlen_local;
  uchar *random_local;
  char *label_local;
  size_t slen_local;
  uchar *secret_local;
  mbedtls_tls_prf_types prf_local;
  
  if (prf == MBEDTLS_SSL_TLS_PRF_SHA256) {
    secret_local._4_4_ = tls_prf_sha256(secret,slen,label,random,rlen,dstbuf,dlen);
  }
  else {
    secret_local._4_4_ = -0x7080;
  }
  return secret_local._4_4_;
}

Assistant:

int  mbedtls_ssl_tls_prf(const mbedtls_tls_prf_types prf,
                         const unsigned char *secret, size_t slen,
                         const char *label,
                         const unsigned char *random, size_t rlen,
                         unsigned char *dstbuf, size_t dlen)
{
    mbedtls_ssl_tls_prf_cb *tls_prf = NULL;

    switch (prf) {
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_MD_CAN_SHA384)
        case MBEDTLS_SSL_TLS_PRF_SHA384:
            tls_prf = tls_prf_sha384;
            break;
#endif /* MBEDTLS_MD_CAN_SHA384*/
#if defined(MBEDTLS_MD_CAN_SHA256)
        case MBEDTLS_SSL_TLS_PRF_SHA256:
            tls_prf = tls_prf_sha256;
            break;
#endif /* MBEDTLS_MD_CAN_SHA256*/
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
        default:
            return MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    }

    return tls_prf(secret, slen, label, random, rlen, dstbuf, dlen);
}